

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WithDelete(sqlite3 *db,With *pWith)

{
  long lVar1;
  Select **ppSVar2;
  
  if (pWith != (With *)0x0) {
    if (0 < pWith->nCte) {
      ppSVar2 = &pWith->a[0].pSelect;
      lVar1 = 0;
      do {
        if ((ExprList *)ppSVar2[-1] != (ExprList *)0x0) {
          exprListDeleteNN(db,(ExprList *)ppSVar2[-1]);
        }
        if (*ppSVar2 != (Select *)0x0) {
          clearSelect(db,*ppSVar2,1);
        }
        if (((Cte *)(ppSVar2 + -2))->zName != (char *)0x0) {
          sqlite3DbFreeNN(db,((Cte *)(ppSVar2 + -2))->zName);
        }
        lVar1 = lVar1 + 1;
        ppSVar2 = ppSVar2 + 4;
      } while (lVar1 < pWith->nCte);
    }
    sqlite3DbFreeNN(db,pWith);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WithDelete(sqlite3 *db, With *pWith){
  if( pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      struct Cte *pCte = &pWith->a[i];
      sqlite3ExprListDelete(db, pCte->pCols);
      sqlite3SelectDelete(db, pCte->pSelect);
      sqlite3DbFree(db, pCte->zName);
    }
    sqlite3DbFree(db, pWith);
  }
}